

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::beginQueries
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  uint local_1c;
  GLuint i;
  Functions *gl;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x20))(0x82ec,this->m_overflow_query);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar1) {
    for (local_1c = 0;
        GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                          (&this->super_TransformFeedbackOverflowQueryBaseTest), local_1c < GVar3;
        local_1c = local_1c + 1) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x28))
                (0x82ed,local_1c,this->m_stream_overflow_query[local_1c]);
    }
  }
  return;
}

Assistant:

void beginQueries()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_overflow_query);

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_stream_overflow_query[i]);
			}
		}
	}